

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.c
# Opt level: O2

int pk_hashlen_helper(mbedtls_md_type_t md_alg,size_t *hash_len)

{
  byte bVar1;
  mbedtls_md_info_t *md_info;
  int iVar2;
  
  iVar2 = 0;
  if (*hash_len == 0) {
    md_info = mbedtls_md_info_from_type(md_alg);
    if (md_info == (mbedtls_md_info_t *)0x0) {
      iVar2 = -1;
    }
    else {
      bVar1 = mbedtls_md_get_size(md_info);
      *hash_len = (ulong)bVar1;
    }
  }
  return iVar2;
}

Assistant:

static inline int pk_hashlen_helper( mbedtls_md_type_t md_alg, size_t *hash_len )
{
    const mbedtls_md_info_t *md_info;

    if( *hash_len != 0 )
        return( 0 );

    if( ( md_info = mbedtls_md_info_from_type( md_alg ) ) == NULL )
        return( -1 );

    *hash_len = mbedtls_md_get_size( md_info );
    return( 0 );
}